

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp16.h
# Opt level: O0

uint16_t fp32_to_fp16<(std::float_round_style)1>(float value)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  bool bVar5;
  int i;
  uint32_t s;
  uint32_t g;
  uint32_t exp;
  uint16_t hbits;
  uint32_t bits;
  float value_local;
  
  g._2_2_ = (ushort)((uint)value >> 0x10) & 0x8000;
  fVar1 = ABS(value);
  uVar2 = (uint)fVar1 >> 0x17;
  if (uVar2 == 0xff) {
    bits._2_2_ = g._2_2_ | 0x7c00 | -(ushort)(((uint)value & 0x7fffff) != 0) & 0x3ff;
  }
  else if (uVar2 < 0x8f) {
    if (uVar2 < 0x71) {
      if (uVar2 < 0x66) {
        i._0_2_ = 0;
        bVar5 = fVar1 != 0.0;
      }
      else {
        bVar4 = -(char)uVar2 + 0x7d;
        uVar3 = (uint)value & 0x7fffff | 0x800000;
        i._0_2_ = (ushort)(uVar3 >> (bVar4 & 0x1f)) & 1;
        bVar5 = ((ulong)uVar3 & (1L << (bVar4 & 0x3f)) - 1U) != 0;
        g._2_2_ = g._2_2_ | (ushort)(uVar3 >> (-(char)uVar2 + 0x7eU & 0x1f));
      }
    }
    else {
      i._0_2_ = (ushort)((uint)fVar1 >> 0xc) & 1;
      bVar5 = ((uint)value & 0xfff) != 0;
      g._2_2_ = g._2_2_ | ((ushort)((uint)fVar1 >> 0x17) - 0x70) * 0x400 |
                          (ushort)((uint)fVar1 >> 0xd) & 0x3ff;
    }
    bits._2_2_ = g._2_2_ + ((ushort)i & (bVar5 | g._2_2_));
  }
  else {
    bits._2_2_ = (g._2_2_ | 0x7bff) + 1;
  }
  return bits._2_2_;
}

Assistant:

uint16_t fp32_to_fp16(float value)
{
    uint32_t bits;
    std::memcpy(&bits, &value, sizeof(bits));

    uint16_t hbits = (bits >> 16) & 0x8000;
    bits &= 0x7FFFFFFF;

    uint32_t exp = bits >> 23;
    if (exp == 255) {
        return hbits | 0x7C00 | (0x3FF & -static_cast<uint32_t>((bits & 0x7FFFFF) != 0));
    }
    if (exp > 142) {
        if (Rounding == std::round_toward_infinity) {
            return (hbits | 0x7C00) - (hbits >> 15);
        }
        if (Rounding == std::round_toward_neg_infinity) {
            return (hbits | 0x7BFF) + (hbits >> 15);
        }
        return (hbits | 0x7BFF) + (Rounding != std::round_toward_zero ? 1 : 0);
    }
    uint32_t g, s;
    if (exp > 112) {
        g = (bits >> 12) & 1;
        s = (bits & 0xFFF) != 0;
        hbits |= ((exp - 112) << 10) | ((bits >> 13) & 0x3FF);
    } else if (exp > 101) {
        int i = 125 - exp;
        bits = (bits & 0x7FFFFF) | 0x800000;
        g = (bits >> i) & 1;
        s = (bits & ((1L << i) - 1)) != 0;
        hbits |= bits >> (i + 1);
    } else {
        g = 0;
        s = bits != 0;
    }
    if constexpr (Rounding == std::round_to_nearest) {
        hbits += g & (s | hbits);
    } else if constexpr (Rounding == std::round_toward_infinity) {
        hbits += ~(hbits >> 15) & (s | g);
    } else if constexpr (Rounding == std::round_toward_neg_infinity) {
        hbits += (hbits >> 15) & (g | s);
    }
    return hbits;
}